

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxTraverse_rec(Gia_Man_t *p,int i)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,i);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrentId(p,i);
    pObj = Gia_ManObj(p,i);
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((int)uVar2 < 0) {
      return;
    }
    if ((uVar2 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    Str_MuxTraverse_rec(p,i - (uVar2 & 0x1fffffff));
    Str_MuxTraverse_rec(p,i - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) break;
    i = Gia_ObjFaninId2(p,i);
  }
  return;
}

Assistant:

void Str_MuxTraverse_rec( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, i) )
        return;
    Gia_ObjSetTravIdCurrentId(p, i);
    pObj = Gia_ManObj(p, i);
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Str_MuxTraverse_rec(p, Gia_ObjFaninId0(pObj, i) );
    Str_MuxTraverse_rec(p, Gia_ObjFaninId1(pObj, i) );
    if ( Gia_ObjIsMux(p, pObj) )
        Str_MuxTraverse_rec(p, Gia_ObjFaninId2(p, i) );
}